

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# senone.c
# Opt level: O3

senone_t * senone_init(logmath_t *logmath,char *mixwfile,char *sen2mgau_map,float64 mixwfloor)

{
  uint32 **buf;
  uint uVar1;
  uint32 uVar2;
  uint32 *puVar3;
  bool bVar4;
  logmath_t *lmath;
  int iVar5;
  int32 iVar6;
  float fVar7;
  FILE *pFVar8;
  size_t sVar9;
  mgau2sen_t *pmVar10;
  uint32 *puVar11;
  void *pvVar12;
  mixw_t *pmVar13;
  size_t sVar14;
  senprob_t **ppsVar15;
  float32 *vec;
  uint32 uVar16;
  ulong uVar17;
  char *fmt;
  char *pcVar18;
  ulong uVar19;
  ulong uVar20;
  char **ppcVar21;
  bool bVar22;
  senprob_t ***pppsVar23;
  uint uVar24;
  uint uVar25;
  ulong uVar26;
  long lVar27;
  FILE *pFVar28;
  senone_t *psVar29;
  int32 n_cw;
  uint32 chksum;
  int32 byteswap;
  char **argval;
  char **argname;
  char eofchk;
  undefined8 in_stack_ffffffffffffff38;
  undefined8 uVar30;
  float local_b0;
  uint32 local_ac;
  int32 local_a8;
  char local_a1;
  char *local_a0;
  char *local_98;
  char **local_90;
  float local_84;
  senone_t *local_80;
  char **local_78;
  undefined1 local_69;
  FILE *local_68;
  uint32 *local_60;
  uint local_54;
  mixw_t *local_50;
  FILE *local_48;
  ulong local_40;
  logmath_t *local_38;
  undefined4 uVar31;
  
  local_50 = (mixw_t *)mixwfloor;
  local_80 = (senone_t *)
             __ckd_calloc__(1,0x28,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                            ,0x154);
  local_80->n_sen = 0;
  local_80->sen2mgau = (uint32 *)0x0;
  if (sen2mgau_map == (char *)0x0) {
    __assert_fail("sen2mgau_map",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                  ,0x158,"senone_t *senone_init(logmath_t *, const char *, const char *, float64)");
  }
  iVar5 = strcmp(sen2mgau_map,".semi.");
  local_98 = mixwfile;
  local_38 = logmath;
  if (iVar5 != 0) {
    iVar5 = strcmp(sen2mgau_map,".cont.");
    if (iVar5 == 0) {
      local_80->n_mgau = 0;
      sen2mgau_map = mixwfile;
      goto LAB_0010333f;
    }
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
            ,0x4a,"Reading senone-codebook map file: %s\n",sen2mgau_map);
    pFVar8 = fopen(sen2mgau_map,"rb");
    if (pFVar8 == (FILE *)0x0) {
      lVar27 = 0x4d;
      goto LAB_00103ced;
    }
    local_68 = pFVar8;
    iVar6 = bio_readhdr((FILE *)pFVar8,&local_78,&local_90,&local_a8);
    if (iVar6 < 0) {
      pcVar18 = "bio_readhdr(%s) failed\n";
      lVar27 = 0x51;
      goto LAB_00103a9d;
    }
    pcVar18 = *local_78;
    local_a0 = sen2mgau_map;
    if (pcVar18 == (char *)0x0) {
      bVar4 = true;
      bVar22 = true;
    }
    else {
      lVar27 = 0;
      bVar22 = false;
      bVar4 = false;
      ppcVar21 = local_78;
      do {
        iVar5 = strcmp(pcVar18,"version");
        if (iVar5 == 0) {
          pcVar18 = *(char **)((long)local_90 + lVar27);
          iVar5 = strcmp(pcVar18,"1.2");
          if (iVar5 != 0) {
            in_stack_ffffffffffffff38 = 0;
            err_msg(ERR_WARN,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                    ,0x5a,"Version mismatch(%s): %s, expecting %s\n",local_a0,pcVar18,"1.2");
            pcVar18 = *(char **)((long)local_90 + lVar27);
          }
          iVar5 = __isoc99_sscanf(pcVar18,"%f",&local_b0);
          if (iVar5 != 1) {
            err_msg(ERR_FATAL,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                    ,0x5f,"%s: Bad version no. string: %s\n",local_a0,
                    *(undefined8 *)((long)local_90 + lVar27));
            goto LAB_00103aa4;
          }
          bVar22 = 1.1 < local_b0;
          ppcVar21 = local_78;
        }
        else {
          iVar5 = strcmp(pcVar18,"chksum0");
          if (iVar5 == 0) {
            bVar4 = true;
          }
        }
        pcVar18 = *(char **)((long)ppcVar21 + lVar27 + 8);
        lVar27 = lVar27 + 8;
      } while (pcVar18 != (char *)0x0);
      bVar22 = !bVar22;
      bVar4 = !bVar4;
      local_78 = ppcVar21;
      mixwfile = local_98;
    }
    psVar29 = local_80;
    buf = &local_80->sen2mgau;
    bio_hdrarg_free(local_78,local_90);
    pFVar8 = local_68;
    local_90 = (char **)0x0;
    local_78 = (char **)0x0;
    local_ac = 0;
    if (!bVar22) {
      iVar6 = bio_fread(&psVar29->n_mgau,4,1,(FILE *)local_68,local_a8,&local_ac);
      if (iVar6 == 1) {
        iVar6 = bio_fread_1d(buf,4,&psVar29->n_sen,(FILE *)pFVar8,local_a8,&local_ac);
        if (-1 < iVar6) {
          uVar19 = (ulong)psVar29->n_sen;
          goto LAB_00103293;
        }
        goto LAB_00103d19;
      }
      pcVar18 = "fread(%s) (#gauden) failed\n";
      lVar27 = 0x6e;
      sen2mgau_map = local_a0;
      goto LAB_00103a9d;
    }
    iVar6 = bio_fread_1d(buf,4,&psVar29->n_sen,(FILE *)local_68,local_a8,&local_ac);
    if (iVar6 < 0) {
LAB_00103d19:
      pcVar18 = "bio_fread_1d(%s) failed\n";
      lVar27 = 0x74;
      sen2mgau_map = local_a0;
      goto LAB_00103a9d;
    }
    psVar29->n_mgau = 1;
    uVar19 = (ulong)psVar29->n_sen;
    if (uVar19 == 0) {
LAB_001032d6:
      if (!bVar4) {
        bio_verify_chksum((FILE *)pFVar8,local_a8,local_ac);
      }
      sVar9 = fread(&local_54,1,1,pFVar8);
      if (sVar9 != 1) {
        fclose(pFVar8);
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                ,0x94,"Read %d->%d senone-codebook mappings\n",(ulong)local_80->n_sen,
                (ulong)local_80->n_mgau);
        sen2mgau_map = mixwfile;
        goto LAB_0010333f;
      }
      pcVar18 = "More data than expected in %s\n";
      lVar27 = 0x90;
      sen2mgau_map = local_a0;
      goto LAB_00103a9d;
    }
    puVar11 = *buf;
    uVar24 = 1;
    uVar17 = 0;
    do {
      if (uVar24 <= puVar11[uVar17]) {
        uVar24 = puVar11[uVar17] + 1;
        local_80->n_mgau = uVar24;
      }
      uVar17 = uVar17 + 1;
    } while (uVar19 != uVar17);
LAB_00103293:
    uVar31 = (undefined4)((ulong)in_stack_ffffffffffffff38 >> 0x20);
    pcVar18 = local_a0;
    if (0x7ffe < (uint)uVar19) {
      lVar27 = 0x81;
      goto LAB_00103d8c;
    }
    uVar24 = local_80->n_mgau;
    if (uVar24 < 0x7fff) {
      if ((uint)uVar19 != 0) {
        uVar17 = 0;
        do {
          uVar1 = (*buf)[uVar17];
          if (uVar24 <= uVar1) {
            pcVar18 = "Bad sen2mgau[%d]= %d, out of range [0, %d)\n";
            lVar27 = 0x89;
            goto LAB_00103ae8;
          }
          uVar17 = uVar17 + 1;
        } while (uVar19 != uVar17);
      }
      goto LAB_001032d6;
    }
    lVar27 = 0x83;
LAB_00103db2:
    uVar30 = CONCAT44(uVar31,0x7fff);
    fmt = "%s: #gauden (%d) exceeds limit (%d)\n";
    uVar19 = (ulong)uVar24;
    goto LAB_00103db5;
  }
  local_80->n_mgau = 1;
  sen2mgau_map = mixwfile;
LAB_0010333f:
  if (sen2mgau_map == (char *)0x0) {
    __assert_fail("mixwfile",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                  ,0x165,"senone_t *senone_init(logmath_t *, const char *, const char *, float64)");
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
          ,0xd2,"Reading senone mixture weights: %s\n",sen2mgau_map);
  pFVar8 = fopen(sen2mgau_map,"rb");
  if (pFVar8 == (FILE *)0x0) {
    lVar27 = 0xd5;
LAB_00103ced:
    err_msg_system(ERR_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                   ,lVar27,"fopen(%s,rb) failed\n",sen2mgau_map);
    goto LAB_00103aa4;
  }
  local_48 = pFVar8;
  iVar6 = bio_readhdr((FILE *)pFVar8,&local_78,&local_90,&local_a8);
  psVar29 = local_80;
  if (iVar6 < 0) {
    pcVar18 = "bio_readhdr(%s) failed\n";
    lVar27 = 0xd9;
    sen2mgau_map = local_98;
  }
  else {
    pcVar18 = *local_78;
    ppcVar21 = local_78;
    if (pcVar18 == (char *)0x0) {
      bVar22 = true;
    }
    else {
      lVar27 = 0;
      bVar22 = false;
      do {
        iVar5 = strcmp(pcVar18,"version");
        if (iVar5 == 0) {
          pcVar18 = *(char **)((long)local_90 + lVar27);
          iVar5 = strcmp(pcVar18,"1.0");
          if (iVar5 != 0) {
            in_stack_ffffffffffffff38 = 0;
            err_msg(ERR_WARN,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                    ,0xe1,"Version mismatch(%s): %s, expecting %s\n",local_98,pcVar18,"1.0");
            ppcVar21 = local_78;
          }
        }
        else {
          iVar5 = strcmp(pcVar18,"chksum0");
          if (iVar5 == 0) {
            bVar22 = true;
          }
        }
        pcVar18 = *(char **)((long)ppcVar21 + lVar27 + 8);
        lVar27 = lVar27 + 8;
      } while (pcVar18 != (char *)0x0);
      bVar22 = !bVar22;
    }
    bio_hdrarg_free(ppcVar21,local_90);
    pFVar8 = local_48;
    local_90 = (char **)0x0;
    local_78 = (char **)0x0;
    local_ac = 0;
    uVar1 = psVar29->n_sen;
    iVar6 = bio_fread(psVar29,4,1,(FILE *)local_48,local_a8,&local_ac);
    if (iVar6 == 1) {
      local_60 = &psVar29->n_feat;
      iVar6 = bio_fread(local_60,4,1,(FILE *)pFVar8,local_a8,&local_ac);
      if (((iVar6 == 1) &&
          (iVar6 = bio_fread(&local_b0,4,1,(FILE *)pFVar8,local_a8,&local_ac), iVar6 == 1)) &&
         (iVar6 = bio_fread(&local_54,4,1,(FILE *)pFVar8,local_a8,&local_ac), iVar6 == 1)) {
        uVar24 = psVar29->n_sen;
        uVar25 = uVar24;
        if ((uVar1 != 0) && (uVar25 = uVar1, uVar24 != uVar1)) {
          pcVar18 = "#senones(%d) conflict with mapping file(%d)\n";
          lVar27 = 0xf4;
          uVar17 = (ulong)uVar24;
LAB_00103ae8:
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                  ,lVar27,pcVar18,uVar17,(ulong)uVar1);
          goto LAB_00103aa4;
        }
        uVar19 = (ulong)uVar25;
        if (uVar25 < 0x7fff) {
          if (*local_60 == 0) {
            pcVar18 = "Bad #features: %d\n";
            lVar27 = 0xf8;
            uVar17 = 0;
          }
          else {
            uVar17 = (ulong)(uint)local_b0;
            if (0 < (int)local_b0) {
              uVar24 = psVar29->n_mgau;
              if (psVar29->sen2mgau == (uint32 *)0x0) {
                if (1 < uVar24) {
                  __assert_fail("(s->n_mgau == 0) || (s->n_mgau == 1)",
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                                ,0xfe,
                                "int32 senone_mixw_read(logmath_t *, senone_t *, const char *, float64)"
                               );
                }
                puVar11 = (uint32 *)
                          __ckd_calloc__(uVar19,4,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                                         ,0x100);
                psVar29->sen2mgau = puVar11;
                uVar16 = psVar29->n_sen;
                if (psVar29->n_mgau == 1) {
                  if (uVar16 != 0) {
                    uVar19 = 0;
                    do {
                      puVar11[uVar19] = 0;
                      uVar19 = uVar19 + 1;
                      uVar25 = psVar29->n_sen;
                    } while (uVar19 < uVar25);
LAB_0010360e:
                    uVar24 = psVar29->n_mgau;
                    goto LAB_00103612;
                  }
                  uVar24 = 1;
                  uVar25 = 0;
                }
                else {
                  psVar29->n_mgau = uVar16;
                  if (uVar16 != 0) {
                    uVar19 = 0;
                    do {
                      puVar11[uVar19] = (uint32)uVar19;
                      uVar19 = uVar19 + 1;
                      uVar25 = psVar29->n_sen;
                    } while (uVar19 < uVar25);
                    goto LAB_0010360e;
                  }
                  uVar25 = 0;
                  uVar24 = 0;
                }
              }
              else {
                if (uVar24 == 0) {
                  __assert_fail("s->n_mgau != 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                                ,0x10d,
                                "int32 senone_mixw_read(logmath_t *, senone_t *, const char *, float64)"
                               );
                }
LAB_00103612:
                if (0x7ffe < uVar24) {
                  uVar31 = (undefined4)((ulong)in_stack_ffffffffffffff38 >> 0x20);
                  lVar27 = 0x10f;
                  pcVar18 = local_98;
                  goto LAB_00103db2;
                }
              }
              fVar7 = local_b0;
              if (local_54 == *local_60 * uVar25 * (int)local_b0) {
                if (((double)local_50 <= 0.0) || (1.0 <= (double)local_50)) {
                  err_msg(ERR_FATAL,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                          ,0x11b,"mixwfloor (%e) not in range (0, 1)\n");
                  goto LAB_00103aa4;
                }
                pmVar10 = (mgau2sen_t *)
                          __ckd_calloc__((ulong)uVar24,0x18,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                                         ,0xa2);
                psVar29->mgau2sen = pmVar10;
                puVar11 = (uint32 *)
                          __ckd_calloc__((ulong)psVar29->n_sen,4,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                                         ,0xa3);
                psVar29->mgau2sen_idx = puVar11;
                sVar14 = (size_t)psVar29->n_sen;
                if (sVar14 == 0) {
                  sVar14 = 0;
                }
                else {
                  puVar11 = psVar29->sen2mgau;
                  uVar24 = psVar29->n_mgau;
                  uVar19 = 0;
                  do {
                    uVar1 = puVar11[uVar19];
                    if (((long)(int)uVar1 < 0) || (uVar24 <= uVar1)) {
                      __assert_fail("(m < s->n_mgau) && (m >= 0)",
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                                    ,0xa6,"void build_mgau2sen(senone_t *, int32)");
                    }
                    psVar29->mgau2sen[(int)uVar1].n_sen = psVar29->mgau2sen[(int)uVar1].n_sen + 1;
                    uVar19 = uVar19 + 1;
                  } while (sVar14 != uVar19);
                }
                pvVar12 = __ckd_calloc__(sVar14,2,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                                         ,0xaa);
                uVar24 = psVar29->n_mgau;
                if ((ulong)uVar24 != 0) {
                  pmVar10 = psVar29->mgau2sen;
                  lVar27 = 0;
                  do {
                    *(void **)((long)&pmVar10->sen + lVar27) = pvVar12;
                    pvVar12 = (void *)((long)pvVar12 +
                                      (long)*(int *)((long)&pmVar10->n_sen + lVar27) * 2);
                    *(undefined4 *)((long)&pmVar10->n_sen + lVar27) = 0;
                    lVar27 = lVar27 + 0x18;
                  } while ((ulong)uVar24 * 0x18 != lVar27);
                }
                local_84 = fVar7;
                if (psVar29->n_sen != 0) {
                  pmVar10 = psVar29->mgau2sen;
                  puVar11 = psVar29->sen2mgau;
                  puVar3 = psVar29->mgau2sen_idx;
                  uVar19 = 0;
                  do {
                    uVar16 = puVar11[uVar19];
                    uVar2 = pmVar10[(int)uVar16].n_sen;
                    pmVar10[(int)uVar16].sen[(int)uVar2] = (s3senid_t)uVar19;
                    puVar3[uVar19] = uVar2;
                    pmVar10[(int)uVar16].n_sen = uVar2 + 1;
                    uVar19 = uVar19 + 1;
                  } while (uVar19 < psVar29->n_sen);
                  uVar24 = psVar29->n_mgau;
                }
                local_a1 = bVar22;
                if (uVar24 != 0) {
                  local_a0 = (char *)(long)(int)fVar7;
                  sVar14 = (size_t)*local_60;
                  pFVar8 = (FILE *)0x0;
                  do {
                    pmVar13 = (mixw_t *)
                              __ckd_calloc__(sVar14,0x10,
                                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                                             ,0xbb);
                    psVar29->mgau2sen[(long)pFVar8].feat_mixw = pmVar13;
                    sVar14 = 0;
                    pFVar28 = pFVar8;
                    if (psVar29->n_feat != 0) {
                      pppsVar23 = &pmVar13->prob;
                      uVar19 = 0;
                      local_68 = pFVar8;
                      do {
                        ((mixw_t *)(pppsVar23 + -1))->n_wt = (int32)fVar7;
                        ppsVar15 = (senprob_t **)
                                   __ckd_calloc_2d__((long)psVar29->mgau2sen[(long)pFVar8].n_sen,
                                                     (size_t)local_a0,1,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                                                  ,0xc1);
                        *pppsVar23 = ppsVar15;
                        uVar19 = uVar19 + 1;
                        sVar14 = (size_t)psVar29->n_feat;
                        pppsVar23 = pppsVar23 + 2;
                        pFVar28 = local_68;
                      } while (uVar19 < sVar14);
                    }
                    pFVar8 = (FILE *)((long)&pFVar28->_flags + 1);
                  } while (pFVar8 < (FILE *)(ulong)psVar29->n_mgau);
                }
                vec = (float32 *)
                      __ckd_calloc__((long)(int)local_b0,4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                                     ,0x121);
                uVar31 = (undefined4)((ulong)in_stack_ffffffffffffff38 >> 0x20);
                uVar16 = psVar29->n_sen;
                pFVar8 = local_48;
                if (uVar16 != 0) {
                  local_84 = (float)(double)local_50;
                  uVar17 = (ulong)*local_60;
                  uVar19 = 0;
                  uVar24 = 0;
                  do {
                    if ((int)uVar17 == 0) {
                      uVar17 = 0;
                    }
                    else {
                      local_50 = psVar29->mgau2sen[(int)psVar29->sen2mgau[uVar19]].feat_mixw;
                      uVar16 = psVar29->mgau2sen_idx[uVar19];
                      uVar20 = (ulong)(uint)local_b0;
                      uVar26 = 0;
                      local_40 = uVar19;
                      do {
                        fVar7 = (float)bio_fread(vec,4,(int32)uVar20,(FILE *)pFVar8,local_a8,
                                                 &local_ac);
                        if (fVar7 != local_b0) {
                          pcVar18 = "bio_fread(%s) (arraydata) failed\n";
                          lVar27 = 0x12d;
                          sen2mgau_map = local_98;
                          goto LAB_00103a9d;
                        }
                        local_a0 = (char *)vector_sum_norm(vec,(int32)fVar7);
                        vector_floor((vector_t)vec,(uint32)local_b0,(float32)local_84);
                        vector_sum_norm(vec,(int32)local_b0);
                        lmath = local_38;
                        uVar20 = (ulong)(uint)local_b0;
                        if (0 < (int)local_b0) {
                          local_68 = (FILE *)CONCAT44(local_68._4_4_,uVar24);
                          pmVar13 = local_50 + uVar26;
                          lVar27 = 0;
                          do {
                            iVar5 = logmath_log(lmath,(float64)(double)(float)vec[lVar27]);
                            pmVar13->prob[(int)uVar16][lVar27] = -(char)iVar5;
                            lVar27 = lVar27 + 1;
                            uVar20 = (ulong)(int)local_b0;
                          } while (lVar27 < (long)uVar20);
                          pFVar8 = local_48;
                          psVar29 = local_80;
                          uVar24 = (uint)local_68;
                        }
                        uVar24 = uVar24 + ((double)local_a0 == 0.0);
                        uVar26 = uVar26 + 1;
                        uVar17 = (ulong)*local_60;
                      } while (uVar26 < uVar17);
                      uVar16 = psVar29->n_sen;
                      uVar19 = local_40;
                    }
                    uVar31 = (undefined4)((ulong)in_stack_ffffffffffffff38 >> 0x20);
                    uVar19 = uVar19 + 1;
                  } while (uVar19 < uVar16);
                  if (0 < (int)uVar24) {
                    err_msg(ERR_WARN,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                            ,0x13e,"Weight normalization failed for %d senones\n",(ulong)uVar24);
                  }
                }
                ckd_free(vec);
                if (local_a1 == '\0') {
                  bio_verify_chksum((FILE *)pFVar8,local_a8,local_ac);
                }
                sVar9 = fread(&local_69,1,1,pFVar8);
                if (sVar9 != 1) {
                  fclose(pFVar8);
                  err_msg(ERR_INFO,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                          ,0x14b,"Read mixture weights for %d senones: %d features x %d codewords\n"
                          ,(ulong)psVar29->n_sen,(ulong)psVar29->n_feat,CONCAT44(uVar31,local_b0));
                  return psVar29;
                }
                pcVar18 = "More data than expected in %s\n";
                lVar27 = 0x146;
                sen2mgau_map = local_98;
                goto LAB_00103a9d;
              }
              uVar30 = CONCAT44((int)((ulong)in_stack_ffffffffffffff38 >> 0x20),uVar25);
              fmt = "%s: #float32 values(%d) doesn\'t match dimensions: %d x %d x %d\n";
              lVar27 = 0x113;
              uVar19 = (ulong)local_54;
              pcVar18 = local_98;
              goto LAB_00103db5;
            }
            pcVar18 = "Bad #mixing-wts/senone: %d\n";
            lVar27 = 0xfa;
          }
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                  ,lVar27,pcVar18,uVar17);
        }
        else {
          uVar31 = (undefined4)((ulong)in_stack_ffffffffffffff38 >> 0x20);
          lVar27 = 0xf6;
          pcVar18 = local_98;
LAB_00103d8c:
          uVar30 = CONCAT44(uVar31,0x7fff);
          fmt = "%s: #senones (%d) exceeds limit (%d)\n";
LAB_00103db5:
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
                  ,lVar27,fmt,pcVar18,uVar19,uVar30);
        }
        goto LAB_00103aa4;
      }
    }
    pcVar18 = "bio_fread(%s) (arraysize) failed\n";
    lVar27 = 0xf1;
    sen2mgau_map = local_98;
  }
LAB_00103a9d:
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/senone.c"
          ,lVar27,pcVar18,sen2mgau_map);
LAB_00103aa4:
  exit(1);
}

Assistant:

senone_t *senone_init (logmath_t *logmath, const char *mixwfile, const char *sen2mgau_map, float64 mixwfloor)
{
    senone_t *s;
    
    s = (senone_t *) ckd_calloc (1, sizeof(senone_t));
    s->n_sen = 0;	/* As yet unknown */
    s->sen2mgau = NULL;

    assert (sen2mgau_map);

    if (strcmp (sen2mgau_map, ".semi.") == 0) {
	/* Not a file; map all senones to a single parent mgau */
	s->n_mgau = 1;	/* But we don't yet know the #senones */
    } else if (strcmp (sen2mgau_map, ".cont.") == 0) {
	/* Not a file; map each senone to its own distinct parent mgau */
	s->n_mgau = 0;	/* We don't yet know the #senones */
    } else {
	/* Read mapping file */
	senone_mgau_map_read (s, sen2mgau_map);	/* Fills in n_sen */
    }
    
    assert (mixwfile);
    senone_mixw_read (logmath, s, mixwfile, mixwfloor);
    
    return s;
}